

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O1

IfcVector3 * __thiscall
Assimp::IFC::TempMesh::Center(IfcVector3 *__return_storage_ptr__,TempMesh *this)

{
  pointer paVar1;
  double dVar2;
  pointer paVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  paVar3 = (this->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar1 = (this->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)paVar1 - (long)paVar3;
  if (lVar4 != 0) {
    lVar4 = (lVar4 >> 3) * -0x5555555555555555;
    dVar2 = 0.0;
    dVar5 = 0.0;
    dVar6 = 0.0;
    do {
      dVar6 = dVar6 + paVar3->x;
      dVar5 = dVar5 + paVar3->y;
      dVar2 = dVar2 + paVar3->z;
      paVar3 = paVar3 + 1;
    } while (paVar3 != paVar1);
    auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar8._0_8_ = lVar4;
    auVar8._12_4_ = 0x45300000;
    dVar7 = 1.0 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    __return_storage_ptr__->x = dVar6 * dVar7;
    __return_storage_ptr__->y = dVar5 * dVar7;
    __return_storage_ptr__->z = dVar7 * dVar2;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  __return_storage_ptr__->z = 0.0;
  return __return_storage_ptr__;
}

Assistant:

IfcVector3 TempMesh::Center() const
{
    return (mVerts.size() == 0) ? IfcVector3(0.0f, 0.0f, 0.0f) : (std::accumulate(mVerts.begin(),mVerts.end(),IfcVector3()) / static_cast<IfcFloat>(mVerts.size()));
}